

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O0

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,string *hex)

{
  size_type sVar1;
  CfdException *this_00;
  ByteData local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  size_type local_98;
  CfdSourceLocation local_90;
  allocator<unsigned_char> local_71;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68 [8];
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string *hex_local;
  BlockHash *this_local;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_0087dd88;
  data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hex;
  hex_local = (string *)this;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte(&local_38,(string *)data);
  local_20 = &local_38;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(local_68);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend(local_70);
  ::std::allocator<unsigned_char>::allocator(&local_71);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_60,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_68,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_70,&local_71);
  ::std::allocator<unsigned_char>::~allocator(&local_71);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  if (sVar1 != 0x20) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_coin.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x4f;
    local_90.funcname = "BlockHash";
    local_98 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    logger::warn<unsigned_long>(&local_90,"BlockHash size Invalid. size={}.",&local_98);
    local_ba = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b8,"BlockHash size Invalid.",&local_b9);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_b8);
    local_ba = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  ByteData::operator=(&this->data_,&local_d8);
  ByteData::~ByteData(&local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  return;
}

Assistant:

BlockHash::BlockHash(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(
        CFD_LOG_SOURCE, "BlockHash size Invalid. size={}.",
        reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "BlockHash size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}